

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void resizestack(lua_State *L,MSize n)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  int in_ESI;
  long in_RDI;
  int32_t oldvmstate;
  GCobj *up;
  MSize realsize;
  MSize oldsize;
  ptrdiff_t delta;
  TValue *oldst;
  TValue *st;
  GCSize in_stack_ffffffffffffffc0;
  GCSize osz;
  void *in_stack_ffffffffffffffc8;
  uint *puVar6;
  
  uVar1 = *(uint *)(in_RDI + 0x24);
  uVar5 = *(uint *)(in_RDI + 0x38);
  uVar2 = in_ESI + 6;
  osz = *(GCSize *)((ulong)*(uint *)(in_RDI + 8) + 0x160);
  *(undefined4 *)((ulong)*(uint *)(in_RDI + 8) + 0x160) = 0xffffffff;
  pvVar3 = lj_mem_realloc((lua_State *)CONCAT44(uVar5,uVar2),in_stack_ffffffffffffffc8,osz,
                          in_stack_ffffffffffffffc0);
  *(int *)(in_RDI + 0x24) = (int)pvVar3;
  lVar4 = (long)pvVar3 - (ulong)uVar1;
  *(int *)(in_RDI + 0x20) = (int)pvVar3 + in_ESI * 8;
  for (; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    *(undefined4 *)((long)pvVar3 + (ulong)uVar5 * 8 + 4) = 0xffffffff;
  }
  *(uint *)(in_RDI + 0x38) = uVar2;
  if ((ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 400) - (ulong)uVar1 < (ulong)uVar5) {
    *(int *)((ulong)*(uint *)(in_RDI + 8) + 400) =
         *(int *)((ulong)*(uint *)(in_RDI + 8) + 400) + (int)lVar4;
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + lVar4;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + lVar4;
  uVar1 = *(uint *)(in_RDI + 0x28);
  while (puVar6 = (uint *)(ulong)uVar1, puVar6 != (uint *)0x0) {
    puVar6[4] = puVar6[4] + (int)lVar4;
    uVar1 = *puVar6;
  }
  *(GCSize *)((ulong)*(uint *)(in_RDI + 8) + 0x160) = osz;
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  int32_t oldvmstate = G(L)->vmstate;

  lj_assertL((MSize)(tvref(L->maxstack)-oldst) == L->stacksize-LJ_STACK_EXTRA-1,
	     "inconsistent stack size");

  /*
  ** Lua stack is inconsistent while reallocation, profilers
  ** depend on vmstate during reports, so set vmstate to INTERP
  ** to avoid inconsistent behaviour.
  */
  setvmstate(G(L), INTERP);
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(oldsize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  if ((size_t)(mref(G(L)->jit_base, char) - (char *)oldst) < oldsize)
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));

  G(L)->vmstate = oldvmstate;
}